

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O3

void __thiscall
TransactionContext_Constructor_Test_Test::~TransactionContext_Constructor_Test_Test
          (TransactionContext_Constructor_Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TransactionContext, Constructor_Test) {
  TransactionContext empty_txc;
  EXPECT_STREQ(empty_txc.GetHex().c_str(), "02000000000000000000");

  std::string exp_tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  Txid txid("0000000000000000000000000000000000000000000000000123456789abcdef");
  TransactionContext hex_txc(exp_tx);
  EXPECT_STREQ(hex_txc.GetHex().c_str(), exp_tx.c_str());

  ByteData byte_data(exp_tx);
  TransactionContext bytes_txc(byte_data);
  EXPECT_STREQ(bytes_txc.GetHex().c_str(), exp_tx.c_str());

  TransactionContext copy_context;
  copy_context = bytes_txc;
  EXPECT_STREQ(copy_context.GetHex().c_str(), exp_tx.c_str());

  TransactionContext clone_context(bytes_txc);
  EXPECT_STREQ(clone_context.GetHex().c_str(), exp_tx.c_str());

  Transaction tx(exp_tx);
  TransactionContext from_tx(tx);
  EXPECT_STREQ(from_tx.GetHex().c_str(), exp_tx.c_str());

  EXPECT_EQ(TransactionContext::GetLockTimeDisabledSequence(), 0xffffffffU);
}